

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

void Wln_NtkFree(Wln_Ntk_t *p)

{
  int iVar1;
  int local_14;
  int i;
  Wln_Ntk_t *p_local;
  
  for (local_14 = 0; iVar1 = Wln_NtkObjNum(p), local_14 < iVar1; local_14 = local_14 + 1) {
    iVar1 = Wln_ObjFaninNum(p,local_14);
    if ((2 < iVar1) && (p->vFanins[local_14].field_2.pArray[0] != (int *)0x0)) {
      free(p->vFanins[local_14].field_2.pArray[0]);
      p->vFanins[local_14].field_2.pArray[0] = (int *)0x0;
    }
  }
  if (p->vFanins != (Wln_Vec_t *)0x0) {
    free(p->vFanins);
    p->vFanins = (Wln_Vec_t *)0x0;
  }
  if (p->pRanges != (Hash_IntMan_t *)0x0) {
    Hash_IntManStop(p->pRanges);
  }
  if (p->pManName != (Abc_Nam_t *)0x0) {
    Abc_NamStop(p->pManName);
  }
  if ((p->vCis).pArray != (int *)0x0) {
    free((p->vCis).pArray);
    (p->vCis).pArray = (int *)0x0;
  }
  if ((p->vCos).pArray != (int *)0x0) {
    free((p->vCos).pArray);
    (p->vCos).pArray = (int *)0x0;
  }
  if ((p->vFfs).pArray != (int *)0x0) {
    free((p->vFfs).pArray);
    (p->vFfs).pArray = (int *)0x0;
  }
  if ((p->vTypes).pArray != (int *)0x0) {
    free((p->vTypes).pArray);
    (p->vTypes).pArray = (int *)0x0;
  }
  if ((p->vSigns).pArray != (char *)0x0) {
    free((p->vSigns).pArray);
    (p->vSigns).pArray = (char *)0x0;
  }
  if ((p->vRanges).pArray != (int *)0x0) {
    free((p->vRanges).pArray);
    (p->vRanges).pArray = (int *)0x0;
  }
  if ((p->vNameIds).pArray != (int *)0x0) {
    free((p->vNameIds).pArray);
    (p->vNameIds).pArray = (int *)0x0;
  }
  if ((p->vInstIds).pArray != (int *)0x0) {
    free((p->vInstIds).pArray);
    (p->vInstIds).pArray = (int *)0x0;
  }
  if ((p->vTravIds).pArray != (int *)0x0) {
    free((p->vTravIds).pArray);
    (p->vTravIds).pArray = (int *)0x0;
  }
  if ((p->vCopies).pArray != (int *)0x0) {
    free((p->vCopies).pArray);
    (p->vCopies).pArray = (int *)0x0;
  }
  if ((p->vBits).pArray != (int *)0x0) {
    free((p->vBits).pArray);
    (p->vBits).pArray = (int *)0x0;
  }
  if ((p->vLevels).pArray != (int *)0x0) {
    free((p->vLevels).pArray);
    (p->vLevels).pArray = (int *)0x0;
  }
  if ((p->vRefs).pArray != (int *)0x0) {
    free((p->vRefs).pArray);
    (p->vRefs).pArray = (int *)0x0;
  }
  if ((p->vFanout).pArray != (int *)0x0) {
    free((p->vFanout).pArray);
    (p->vFanout).pArray = (int *)0x0;
  }
  if ((p->vFaninAttrs).pArray != (int *)0x0) {
    free((p->vFaninAttrs).pArray);
    (p->vFaninAttrs).pArray = (int *)0x0;
  }
  if ((p->vFaninLists).pArray != (int *)0x0) {
    free((p->vFaninLists).pArray);
    (p->vFaninLists).pArray = (int *)0x0;
  }
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  if (p != (Wln_Ntk_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Wln_NtkFree( Wln_Ntk_t * p )
{
    int i;
    for ( i = 0; i < Wln_NtkObjNum(p); i++ )
        if ( Wln_ObjFaninNum(p, i) > 2 ) 
            ABC_FREE( p->vFanins[i].pArray[0] );
    ABC_FREE( p->vFanins );

    if ( p->pRanges )  Hash_IntManStop( p->pRanges );
    if ( p->pManName ) Abc_NamStop( p->pManName );

    ABC_FREE( p->vCis.pArray );
    ABC_FREE( p->vCos.pArray );
    ABC_FREE( p->vFfs.pArray );

    ABC_FREE( p->vTypes.pArray );
    ABC_FREE( p->vSigns.pArray );
    ABC_FREE( p->vRanges.pArray );
    ABC_FREE( p->vNameIds.pArray );
    ABC_FREE( p->vInstIds.pArray );
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vCopies.pArray );
    ABC_FREE( p->vBits.pArray );
    ABC_FREE( p->vLevels.pArray );
    ABC_FREE( p->vRefs.pArray );
    ABC_FREE( p->vFanout.pArray );
    ABC_FREE( p->vFaninAttrs.pArray );
    ABC_FREE( p->vFaninLists.pArray );

    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p );
}